

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O2

Abc_Ntk_t * Io_ReadBlifAsAig(char *pFileName,int fCheck)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  FILE *pFVar8;
  Io_BlifMan_t *p;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  char *pcVar11;
  byte *pbVar12;
  size_t sVar13;
  Io_BlifObj_t *pIVar14;
  Io_BlifObj_t **ppIVar15;
  void *pvVar16;
  Abc_Ntk_t *pAVar17;
  Abc_Obj_t *pAVar18;
  uint *puVar19;
  Abc_Obj_t *pAVar20;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar21;
  long *plVar22;
  byte *pbVar23;
  byte bVar24;
  byte *pbVar25;
  ulong uVar26;
  int i;
  int iVar27;
  char *pcVar28;
  ulong uVar29;
  int Counter;
  
  pFVar8 = fopen(pFileName,"rb");
  if (pFVar8 == (FILE *)0x0) {
    puts("Io_Blif(): The file is unavailable (absent or open).");
    return (Abc_Ntk_t *)0x0;
  }
  fclose(pFVar8);
  p = (Io_BlifMan_t *)calloc(1,0x298);
  pVVar9 = Vec_PtrAlloc(0x200);
  p->vLines = pVVar9;
  pVVar9 = Vec_PtrAlloc(0x200);
  p->vInputs = pVVar9;
  pVVar9 = Vec_PtrAlloc(0x200);
  p->vOutputs = pVVar9;
  pVVar9 = Vec_PtrAlloc(0x200);
  p->vLatches = pVVar9;
  pVVar9 = Vec_PtrAlloc(0x200);
  p->vNames = pVVar9;
  pVVar9 = Vec_PtrAlloc(0x200);
  p->vTokens = pVVar9;
  pVVar9 = Vec_PtrAlloc(0x200);
  p->vPis = pVVar9;
  pVVar9 = Vec_PtrAlloc(0x200);
  p->vPos = pVVar9;
  pVVar9 = Vec_PtrAlloc(0x200);
  p->vLis = pVVar9;
  pVVar9 = Vec_PtrAlloc(0x200);
  p->vLos = pVVar9;
  p->pFileName = pFileName;
  pFVar8 = fopen(pFileName,"rb");
  if (pFVar8 == (FILE *)0x0) {
    pcVar11 = "Io_BlifLoadFile(): The file is unavailable (absent or open).";
  }
  else {
    bVar2 = false;
    fseek(pFVar8,0,2);
    lVar10 = ftell(pFVar8);
    iVar27 = (int)lVar10;
    if (iVar27 != 0) {
      pcVar11 = (char *)malloc((long)(iVar27 + 10));
      rewind(pFVar8);
      fread(pcVar11,(long)iVar27,1,pFVar8);
      fclose(pFVar8);
      builtin_strncpy(pcVar11 + iVar27,"\n.end\n",7);
      p->pBuffer = pcVar11;
      Vec_PtrPush(p->vLines,pcVar11);
      pcVar11 = p->pBuffer;
      do {
        while( true ) {
          pcVar28 = pcVar11 + 1;
          cVar1 = *pcVar11;
          if (cVar1 != '\n') break;
          *pcVar11 = '\0';
          Vec_PtrPush(p->vLines,pcVar28);
LAB_002da85c:
          bVar2 = false;
          pcVar11 = pcVar28;
        }
        bVar3 = true;
        if (cVar1 != '#') {
          if (cVar1 == '\0') goto LAB_002da875;
          bVar3 = bVar2;
          if (!bVar2) goto LAB_002da85c;
        }
        bVar2 = bVar3;
        *pcVar11 = '\0';
        pcVar11 = pcVar28;
      } while( true );
    }
    fclose(pFVar8);
    pcVar11 = "Io_BlifLoadFile(): The file is empty.";
  }
  puts(pcVar11);
  p->pBuffer = (char *)0x0;
  Io_BlifFree(p);
  return (Abc_Ntk_t *)0x0;
LAB_002db361:
  if (iVar27 != 0) {
    uVar7 = (uVar7 + iVar27) - 1;
  }
LAB_002db36b:
  uVar29 = uVar29 + 1;
  goto LAB_002db31e;
LAB_002da875:
  for (iVar27 = 0; iVar27 < p->vLines->nSize; iVar27 = iVar27 + 1) {
    pbVar12 = (byte *)Vec_PtrEntry(p->vLines,iVar27);
    bVar4 = *pbVar12;
    if (bVar4 != 0) {
      pbVar25 = pbVar12 + -2;
      pbVar23 = pbVar12;
      while( true ) {
        pbVar23 = pbVar23 + -1;
        bVar24 = *pbVar25;
        if (((pbVar25 < p->pBuffer) || (0x20 < bVar24)) ||
           ((0x100002600U >> ((ulong)(uint)bVar24 & 0x3f) & 1) == 0)) break;
        pbVar25 = pbVar25 + -1;
      }
      if (bVar24 == 0x5c) {
        bVar4 = 0x5c;
        while (pbVar23[-1] = 0x20, bVar4 != 0) {
          bVar4 = *pbVar23;
          pbVar23 = pbVar23 + 1;
        }
      }
      else {
        while (pbVar25 = pbVar12 + 1, bVar4 < 0x2f) {
          if ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) == 0) {
            if ((ulong)bVar4 != 0x2e) break;
            iVar5 = strncmp((char *)pbVar25,"names",5);
            if (iVar5 == 0) {
              pVVar9 = p->vNames;
            }
            else {
              iVar5 = strncmp((char *)pbVar25,"latch",5);
              if (iVar5 == 0) {
                pVVar9 = p->vLatches;
              }
              else {
                iVar5 = strncmp((char *)pbVar25,"inputs",6);
                if (iVar5 == 0) {
                  pVVar9 = p->vInputs;
                }
                else {
                  iVar5 = strncmp((char *)pbVar25,"outputs",7);
                  if (iVar5 != 0) {
                    iVar5 = strncmp((char *)pbVar25,"model",5);
                    if (iVar5 == 0) {
                      p->pModel = (char *)pbVar25;
                    }
                    else {
                      if ((((*pbVar25 == 0x65) && (pbVar12[2] == 0x6e)) && (pbVar12[3] == 100)) ||
                         (iVar5 = strncmp((char *)pbVar25,"exdc",4), iVar5 == 0)) goto LAB_002daa35;
                      sVar13 = strlen((char *)pbVar12);
                      if (pbVar25[sVar13 - 2] == 0xd) {
                        pbVar12[sVar13 - 1] = 0;
                      }
                      pFVar8 = _stdout;
                      uVar6 = Io_BlifGetLine(p,(char *)pbVar12);
                      fprintf(pFVar8,"Line %d: Skipping line \"%s\".\n",(ulong)uVar6,pbVar12);
                    }
                    break;
                  }
                  pVVar9 = p->vOutputs;
                }
              }
            }
            Vec_PtrPush(pVVar9,pbVar25);
            break;
          }
          pbVar12 = pbVar25;
          bVar4 = *pbVar25;
        }
      }
    }
  }
LAB_002daa35:
  iVar5 = 0;
  for (iVar27 = 0; iVar27 < p->vInputs->nSize; iVar27 = iVar27 + 1) {
    pbVar12 = (byte *)Vec_PtrEntry(p->vInputs,iVar27);
    bVar4 = 1;
LAB_002daa4c:
    uVar26 = (ulong)*pbVar12;
    if (0x20 < uVar26) {
LAB_002daa78:
      bVar24 = 1;
LAB_002daa5d:
      iVar5 = iVar5 + (uint)(bVar4 & (bVar24 ^ 1));
      pbVar12 = pbVar12 + 1;
      bVar4 = bVar24;
      goto LAB_002daa4c;
    }
    if ((0x100002600U >> (uVar26 & 0x3f) & 1) != 0) {
      bVar24 = 0;
      goto LAB_002daa5d;
    }
    if (uVar26 != 0) goto LAB_002daa78;
  }
  iVar27 = p->vNames->nSize + iVar5 + p->vLatches->nSize + 0x200;
  p->nObjects = iVar27;
  pIVar14 = (Io_BlifObj_t *)calloc(1,(long)iVar27 << 5);
  p->pObjects = pIVar14;
  p->nTableSize = iVar27 / 2 + 1;
  ppIVar15 = (Io_BlifObj_t **)calloc(1,(long)(iVar27 / 2) * 8 + 8);
  p->pTable = ppIVar15;
  Io_BlifSplitIntoTokens(p->vTokens,p->pModel,'\0');
  pcVar11 = (char *)Vec_PtrEntry(p->vTokens,0);
  iVar27 = strcmp(pcVar11,"model");
  if (iVar27 != 0) {
    __assert_fail("!strcmp(pToken, \"model\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlifAig.c"
                  ,0x268,"int Io_BlifParseModel(Io_BlifMan_t *, char *)");
  }
  if (p->vTokens->nSize == 2) {
    pcVar11 = (char *)Vec_PtrEntry(p->vTokens,1);
    p->pModel = pcVar11;
    for (iVar27 = 0; iVar27 < p->vInputs->nSize; iVar27 = iVar27 + 1) {
      pcVar11 = (char *)Vec_PtrEntry(p->vInputs,iVar27);
      Io_BlifSplitIntoTokens(p->vTokens,pcVar11,'\0');
      pcVar11 = (char *)Vec_PtrEntry(p->vTokens,0);
      iVar5 = strcmp(pcVar11,"inputs");
      if (iVar5 != 0) {
        __assert_fail("!strcmp(pToken, \"inputs\")",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlifAig.c"
                      ,0x284,"int Io_BlifParseInputs(Io_BlifMan_t *, char *)");
      }
      for (iVar5 = 1; iVar5 < p->vTokens->nSize; iVar5 = iVar5 + 1) {
        pcVar11 = (char *)Vec_PtrEntry(p->vTokens,iVar5);
        pIVar14 = Io_BlifHashFindOrAdd(p,pcVar11);
        if ((*(uint *)pIVar14 & 1) != 0) {
          uVar6 = Io_BlifGetLine(p,pcVar11);
          pcVar28 = "Line %d: Primary input (%s) is defined more than once.";
          uVar26 = (ulong)uVar6;
          goto LAB_002dac68;
        }
        *(uint *)pIVar14 = *(uint *)pIVar14 | 1;
        Vec_PtrPush(p->vPis,pIVar14);
      }
    }
    for (iVar27 = 0; iVar27 < p->vOutputs->nSize; iVar27 = iVar27 + 1) {
      pcVar11 = (char *)Vec_PtrEntry(p->vOutputs,iVar27);
      Io_BlifSplitIntoTokens(p->vTokens,pcVar11,'\0');
      pcVar11 = (char *)Vec_PtrEntry(p->vTokens,0);
      iVar5 = strcmp(pcVar11,"outputs");
      if (iVar5 != 0) {
        __assert_fail("!strcmp(pToken, \"outputs\")",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlifAig.c"
                      ,0x2a5,"int Io_BlifParseOutputs(Io_BlifMan_t *, char *)");
      }
      for (iVar5 = 1; iVar5 < p->vTokens->nSize; iVar5 = iVar5 + 1) {
        pcVar11 = (char *)Vec_PtrEntry(p->vTokens,iVar5);
        pIVar14 = Io_BlifHashFindOrAdd(p,pcVar11);
        pFVar8 = _stdout;
        uVar6 = *(uint *)pIVar14;
        if ((uVar6 & 2) != 0) {
          uVar6 = Io_BlifGetLine(p,pcVar11);
          fprintf(pFVar8,"Line %d: Primary output (%s) is defined more than once (warning only).\n",
                  (ulong)uVar6,pcVar11);
          uVar6 = *(uint *)pIVar14;
        }
        *(uint *)pIVar14 = uVar6 | 2;
        Vec_PtrPush(p->vPos,pIVar14);
      }
    }
    for (iVar27 = 0; iVar27 < p->vLatches->nSize; iVar27 = iVar27 + 1) {
      pcVar11 = (char *)Vec_PtrEntry(p->vLatches,iVar27);
      Io_BlifSplitIntoTokens(p->vTokens,pcVar11,'\0');
      pcVar11 = (char *)Vec_PtrEntry(p->vTokens,0);
      iVar5 = strcmp(pcVar11,"latch");
      if (iVar5 != 0) {
        __assert_fail("!strcmp(pToken, \"latch\")",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlifAig.c"
                      ,0x2c3,"int Io_BlifParseLatch(Io_BlifMan_t *, char *)");
      }
      pVVar9 = p->vTokens;
      if (pVVar9->nSize < 3) {
        uVar6 = Io_BlifGetLine(p,pcVar11);
        pAVar17 = (Abc_Ntk_t *)0x0;
        sprintf(p->sError,"Line %d: Latch does not have input name and output name.",(ulong)uVar6);
        goto LAB_002dac6f;
      }
      uVar6 = 0xc0;
      if (pVVar9->nSize != 3) {
        pcVar28 = (char *)Vec_PtrEntry(pVVar9,3);
        uVar7 = atoi(pcVar28);
        if (uVar7 < 3) {
          uVar6 = (uVar7 != 1 | 2) << 6;
          if (uVar7 == 0) {
            uVar6 = 0x40;
          }
          pVVar9 = p->vTokens;
          goto LAB_002dae61;
        }
        uVar6 = Io_BlifGetLine(p,pcVar11);
        pcVar11 = (char *)Vec_PtrEntry(p->vTokens,3);
        pcVar28 = "Line %d: Initial state of the latch is incorrect (%s).";
LAB_002db05f:
        uVar26 = (ulong)uVar6;
        goto LAB_002dac68;
      }
LAB_002dae61:
      pcVar28 = (char *)Vec_PtrEntry(pVVar9,1);
      pIVar14 = Io_BlifHashFindOrAdd(p,pcVar28);
      *(byte *)pIVar14 = *(byte *)pIVar14 | 4;
      Vec_PtrPush(p->vLis,pIVar14);
      *(uint *)pIVar14 = *(uint *)pIVar14 & 0xffffff3f | uVar6;
      pcVar28 = (char *)Vec_PtrEntry(p->vTokens,2);
      pIVar14 = Io_BlifHashFindOrAdd(p,pcVar28);
      uVar7 = *(uint *)pIVar14;
      if ((uVar7 & 1) != 0) {
        uVar6 = Io_BlifGetLine(p,pcVar11);
        pcVar11 = (char *)Vec_PtrEntry(p->vTokens,2);
        pcVar28 = "Line %d: Primary input (%s) is also defined latch output.";
        goto LAB_002db05f;
      }
      if ((uVar7 & 8) != 0) {
        uVar6 = Io_BlifGetLine(p,pcVar11);
        pcVar11 = (char *)Vec_PtrEntry(p->vTokens,2);
        pcVar28 = "Line %d: Latch output (%s) is defined as the output of another latch.";
        goto LAB_002db05f;
      }
      *(uint *)pIVar14 = uVar7 | 8;
      Vec_PtrPush(p->vLos,pIVar14);
      *(uint *)pIVar14 = *(uint *)pIVar14 & 0xffffff3f | uVar6;
    }
    for (iVar27 = 0; iVar27 < p->vNames->nSize; iVar27 = iVar27 + 1) {
      pcVar11 = (char *)Vec_PtrEntry(p->vNames,iVar27);
      Io_BlifSplitIntoTokens(p->vTokens,pcVar11,'\0');
      pcVar11 = (char *)Vec_PtrEntry(p->vTokens,0);
      iVar5 = strcmp(pcVar11,"names");
      if (iVar5 != 0) {
        __assert_fail("!strcmp((char *)Vec_PtrEntry(p->vTokens,0), \"names\")",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlifAig.c"
                      ,0x300,"int Io_BlifParseNames(Io_BlifMan_t *, char *)");
      }
      lVar10 = (long)p->vTokens->nSize;
      if (lVar10 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
      }
      pcVar11 = (char *)p->vTokens->pArray[lVar10 + -1];
      pIVar14 = Io_BlifHashFindOrAdd(p,pcVar11);
      uVar6 = *(uint *)pIVar14;
      if ((uVar6 & 1) != 0) {
        uVar6 = Io_BlifGetLine(p,pcVar11);
        pcVar28 = "Line %d: Primary input (%s) has a table.";
LAB_002db26e:
        uVar26 = (ulong)uVar6;
LAB_002dac68:
        pAVar17 = (Abc_Ntk_t *)0x0;
        sprintf(p->sError,pcVar28,uVar26,pcVar11);
        goto LAB_002dac6f;
      }
      if ((uVar6 & 8) != 0) {
        uVar6 = Io_BlifGetLine(p,pcVar11);
        pcVar28 = "Line %d: Latch output (%s) has a table.";
        goto LAB_002db26e;
      }
      if ((uVar6 & 0x10) != 0) {
        uVar6 = Io_BlifGetLine(p,pcVar11);
        pcVar28 = "Line %d: Signal (%s) is defined more than once.";
        goto LAB_002db26e;
      }
      *(uint *)pIVar14 = uVar6 | 0x10;
      pIVar14->pName = pcVar11;
      pvVar16 = Vec_PtrEntry(p->vTokens,1);
      *(uint *)pIVar14 = ((int)pcVar11 - (int)pvVar16) * 0x100 | (uint)*(byte *)pIVar14;
    }
    pAVar17 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
    p->pAig = pAVar17;
    pcVar11 = Extra_UtilStrsav(p->pModel);
    pAVar17->pName = pcVar11;
    pcVar11 = Extra_UtilStrsav(p->pFileName);
    pAVar17->pSpec = pcVar11;
    for (iVar27 = 0; iVar27 < p->vPis->nSize; iVar27 = iVar27 + 1) {
      pvVar16 = Vec_PtrEntry(p->vPis,iVar27);
      pAVar18 = Abc_NtkCreateObj(pAVar17,ABC_OBJ_PI);
      Abc_ObjAssignName(pAVar18,*(char **)((long)pvVar16 + 8),(char *)0x0);
      *(Abc_Obj_t **)((long)pvVar16 + 0x10) = pAVar18;
    }
    for (iVar27 = 0; iVar27 < p->vPos->nSize; iVar27 = iVar27 + 1) {
      pvVar16 = Vec_PtrEntry(p->vPos,iVar27);
      pAVar18 = Abc_NtkCreateObj(pAVar17,ABC_OBJ_PO);
      Abc_ObjAssignName(pAVar18,*(char **)((long)pvVar16 + 8),(char *)0x0);
    }
    for (iVar27 = 0; iVar27 < p->vLos->nSize; iVar27 = iVar27 + 1) {
      puVar19 = (uint *)Vec_PtrEntry(p->vLos,iVar27);
      pAVar18 = Abc_NtkCreateObj(pAVar17,ABC_OBJ_BI);
      pvVar16 = Vec_PtrEntry(p->vLis,iVar27);
      Abc_ObjAssignName(pAVar18,*(char **)((long)pvVar16 + 8),(char *)0x0);
      pAVar20 = Abc_NtkCreateObj(pAVar17,ABC_OBJ_LATCH);
      aVar21._0_4_ = *puVar19 >> 6 & 3;
      aVar21._4_4_ = 0;
      pAVar20->field_5 = aVar21;
      Abc_ObjAssignName(pAVar20,*(char **)(puVar19 + 2),"L");
      Abc_ObjAddFanin(pAVar20,pAVar18);
      pAVar18 = Abc_NtkCreateObj(pAVar17,ABC_OBJ_BO);
      Abc_ObjAssignName(pAVar18,*(char **)(puVar19 + 2),(char *)0x0);
      Abc_ObjAddFanin(pAVar18,pAVar20);
      *(Abc_Obj_t **)(puVar19 + 4) = pAVar18;
    }
    pAVar17 = (Abc_Ntk_t *)0x0;
    for (iVar27 = 0; iVar27 < p->vPos->nSize; iVar27 = iVar27 + 1) {
      pvVar16 = Vec_PtrEntry(p->vPos,iVar27);
      pAVar18 = Io_BlifParseConstruct_rec(p,*(char **)((long)pvVar16 + 8));
      if (pAVar18 == (Abc_Obj_t *)0x0) goto LAB_002dac6f;
      pAVar20 = (Abc_Obj_t *)Vec_PtrEntry(p->pAig->vPos,iVar27);
      Abc_ObjAddFanin(pAVar20,pAVar18);
    }
    pAVar17 = (Abc_Ntk_t *)0x0;
    for (iVar27 = 0; iVar27 < p->vLis->nSize; iVar27 = iVar27 + 1) {
      pvVar16 = Vec_PtrEntry(p->vLis,iVar27);
      pAVar18 = Io_BlifParseConstruct_rec(p,*(char **)((long)pvVar16 + 8));
      if (pAVar18 == (Abc_Obj_t *)0x0) goto LAB_002dac6f;
      plVar22 = (long *)Vec_PtrEntry(p->pAig->vBoxes,iVar27);
      Abc_ObjAddFanin(*(Abc_Obj_t **)
                       (*(long *)(*(long *)(*plVar22 + 0x20) + 8) + (long)*(int *)plVar22[4] * 8),
                      pAVar18);
    }
    iVar27 = p->vNames->nSize - p->nTablesRead;
    p->nTablesLeft = iVar27;
    if (iVar27 != 0) {
      printf("The number of dangling tables = %d.\n");
    }
    uVar6 = p->pAig->nObjCounts[7];
    uVar29 = 0;
    uVar26 = (ulong)(uint)p->iObjNext;
    if (p->iObjNext < 1) {
      uVar26 = uVar29;
    }
    uVar7 = 0;
LAB_002db31e:
    if (uVar29 != uVar26) {
      if ((undefined1  [32])((undefined1  [32])p->pObjects[uVar29] & (undefined1  [32])0x10) !=
          (undefined1  [32])0x0) {
        pcVar11 = p->pObjects[uVar29].pName;
        sVar13 = strlen(pcVar11);
        pbVar12 = (byte *)(pcVar11 + sVar13);
        iVar27 = 0;
        do {
          if (*pbVar12 - 0x30 < 2) {
            iVar27 = iVar27 + 1;
          }
          else if (*pbVar12 == 0x2e) goto LAB_002db361;
          pbVar12 = pbVar12 + 1;
        } while( true );
      }
      goto LAB_002db36b;
    }
    printf("AND nodes = %6d.  Estimate = %6d.\n",(ulong)uVar6,(ulong)uVar7);
    pAVar17 = p->pAig;
    p->pAig = (Abc_Ntk_t *)0x0;
  }
  else {
    uVar6 = Io_BlifGetLine(p,pcVar11);
    pAVar17 = (Abc_Ntk_t *)0x0;
    sprintf(p->sError,"Line %d: Model line has %d entries while it should have 2.",(ulong)uVar6,
            (ulong)(uint)p->vTokens->nSize);
  }
LAB_002dac6f:
  if (p->sError[0] != '\0') {
    fprintf(_stdout,"%s\n",p->sError);
  }
  if (pAVar17 != (Abc_Ntk_t *)0x0) {
    Io_BlifFree(p);
    if (fCheck == 0) {
      return pAVar17;
    }
    iVar27 = Abc_NtkCheckRead(pAVar17);
    if (iVar27 != 0) {
      return pAVar17;
    }
    puts("Io_Blif: The network check has failed.");
    Abc_NtkDelete(pAVar17);
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Io_ReadBlifAsAig( char * pFileName, int fCheck )
{
    FILE * pFile;
    Io_BlifMan_t * p;
    Abc_Ntk_t * pAig;

    // check that the file is available
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Io_Blif(): The file is unavailable (absent or open).\n" );
        return 0;
    }
    fclose( pFile );

    // start the file reader
    p = Io_BlifAlloc();
    p->pFileName = pFileName;
    p->pBuffer   = Io_BlifLoadFile( pFileName );
    if ( p->pBuffer == NULL )
    {
        Io_BlifFree( p );
        return NULL;
    }
    // prepare the file for parsing
    Io_BlifReadPreparse( p );
    // construct the network
    pAig = Io_BlifParse( p );
    if ( p->sError[0] )
        fprintf( stdout, "%s\n", p->sError );
    if ( pAig == NULL )
        return NULL;
    Io_BlifFree( p );

    // make sure that everything is okay with the network structure
    if ( fCheck && !Abc_NtkCheckRead( pAig ) )
    {
        printf( "Io_Blif: The network check has failed.\n" );
        Abc_NtkDelete( pAig );
        return NULL;
    }
    return pAig;
}